

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O1

void __thiscall YAML::Scanner::ScanAnchorOrAlias(Scanner *this)

{
  int iVar1;
  Stream *pSVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  RegEx *pRVar6;
  Exception *pEVar7;
  char *pcVar8;
  string name;
  Mark local_b8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [32];
  
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  pSVar2 = *(Stream **)&(this->INPUT).m_mark;
  iVar1 = (this->INPUT).m_mark.column;
  cVar3 = YAML::Stream::get(&this->INPUT);
  while( true ) {
    bVar4 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
    if (!bVar4) break;
    pRVar6 = Exp::Anchor();
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar6,(StreamCharSource *)local_88);
    if (iVar5 < 0) break;
    YAML::Stream::get(&this->INPUT);
    std::__cxx11::string::push_back((char)&local_a8);
  }
  if (local_a0 == 0) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x40);
    local_b8.pos = (this->INPUT).m_mark.pos;
    local_b8.line = (this->INPUT).m_mark.line;
    local_b8.column = (this->INPUT).m_mark.column;
    pcVar8 = "anchor not found after &";
    if (cVar3 == '*') {
      pcVar8 = "alias not found after *";
    }
    local_88._0_8_ = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,pcVar8,pcVar8 + (0x18 - (ulong)(cVar3 == '*')));
    Exception::Exception(pEVar7,&local_b8,(string *)local_88);
    *(undefined ***)pEVar7 = &PTR__BadFile_008899d0;
    __cxa_throw(pEVar7,&ParserException::typeinfo,BadFile::~BadFile);
  }
  bVar4 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
  if (bVar4) {
    pRVar6 = Exp::AnchorEnd();
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar6,(StreamCharSource *)local_88);
    if (iVar5 < 0) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x40);
      local_b8.pos = (this->INPUT).m_mark.pos;
      local_b8.line = (this->INPUT).m_mark.line;
      local_b8.column = (this->INPUT).m_mark.column;
      pcVar8 = "illegal character found while scanning anchor";
      if (cVar3 == '*') {
        pcVar8 = "illegal character found while scanning alias";
      }
      local_88._0_8_ = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,pcVar8,pcVar8 + ((ulong)(cVar3 == '*') ^ 0x2d));
      Exception::Exception(pEVar7,&local_b8,(string *)local_88);
      *(undefined ***)pEVar7 = &PTR__BadFile_008899d0;
      __cxa_throw(pEVar7,&ParserException::typeinfo,BadFile::~BadFile);
    }
  }
  local_88._0_8_ = (ulong)(cVar3 == '*') << 0x20 | 0x1000000000;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = 0;
  local_50._12_4_ = 0;
  local_50._16_4_ = 0;
  local_50._20_8_ = 0;
  local_88._8_8_ = pSVar2;
  local_78._0_4_ = iVar1;
  local_78._8_8_ = &local_60;
  std::__cxx11::string::_M_assign((string *)(local_78 + 8));
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void Scanner::ScanAnchorOrAlias() {
  bool alias;
  std::string name;

  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat the indicator
  Mark mark = INPUT.mark();
  char indicator = INPUT.get();
  alias = (indicator == Keys::Alias);

  // now eat the content
  while (INPUT && Exp::Anchor().Matches(INPUT))
    name += INPUT.get();

  // we need to have read SOMETHING!
  if (name.empty())
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::ALIAS_NOT_FOUND
                                              : ErrorMsg::ANCHOR_NOT_FOUND);

  // and needs to end correctly
  if (INPUT && !Exp::AnchorEnd().Matches(INPUT))
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::CHAR_IN_ALIAS
                                              : ErrorMsg::CHAR_IN_ANCHOR);

  // and we're done
  Token token(alias ? Token::ALIAS : Token::ANCHOR, mark);
  token.value = name;
  m_tokens.push(token);
}